

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::TimestampTestInstance
          (TimestampTestInstance *this,Context *context,StageFlagVector *stages,bool inRenderPass)

{
  undefined1 auVar1 [16];
  RefData<vk::Handle<(vk::HandleType)11>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  DeviceInterface *vk_00;
  VkDevice device;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  const_reference pvVar2;
  NotSupportedError *this_00;
  Handle<(vk::HandleType)24> *pHVar3;
  size_type sVar4;
  ulong uVar5;
  deUint64 *pdVar6;
  Move<vk::Handle<(vk::HandleType)6>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)6>_> local_1b8;
  undefined1 auStack_198 [8];
  VkFenceCreateInfo fenceParams;
  Move<vk::VkCommandBuffer_s_*> local_178;
  RefData<vk::VkCommandBuffer_s_*> local_158;
  Move<vk::Handle<(vk::HandleType)24>_> local_138;
  RefData<vk::Handle<(vk::HandleType)24>_> local_118;
  Move<vk::Handle<(vk::HandleType)11>_> local_f8;
  RefData<vk::Handle<(vk::HandleType)11>_> local_d8;
  undefined1 auStack_b8 [8];
  VkQueryPoolCreateInfo queryPoolParams;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  bool inRenderPass_local;
  StageFlagVector *stages_local;
  Context *context_local;
  TimestampTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__TimestampTestInstance_016a2cf0
  ;
  std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::vector
            (&this->m_stages,stages);
  this->m_inRenderPass = inRenderPass;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_cmdPool);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_cmdBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(&this->m_fence);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::Move(&this->m_queryPool);
  vk_00 = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueProperties.
  super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_68,vk_01,physicalDevice);
  pvVar2 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
           operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       *)local_68,
                      (ulong)queueProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  if (pvVar2->timestampValidBits == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Universal queue does not support timestamps",&local_89);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_88);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             local_68);
  queryPoolParams.pNext = (void *)0x200000000;
  queryPoolParams.flags = 8;
  queryPoolParams.queryType = VK_QUERY_TYPE_OCCLUSION;
  auStack_b8 = (undefined1  [8])0xb;
  queryPoolParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queryPoolParams._4_4_ = 0;
  ::vk::createQueryPool
            (&local_f8,vk_00,device,(VkQueryPoolCreateInfo *)auStack_b8,(VkAllocationCallbacks *)0x0
            );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_d8,(Move *)&local_f8);
  data.deleter.m_deviceIface = local_d8.deleter.m_deviceIface;
  data.object.m_internal = local_d8.object.m_internal;
  data.deleter.m_device = local_d8.deleter.m_device;
  data.deleter.m_allocator = local_d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::operator=(&this->m_queryPool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_f8);
  ::vk::createCommandPool
            (&local_138,vk_00,device,1,
             queueProperties.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_118,(Move *)&local_138);
  data_00.deleter.m_deviceIface = local_118.deleter.m_deviceIface;
  data_00.object.m_internal = local_118.object.m_internal;
  data_00.deleter.m_device = local_118.deleter.m_device;
  data_00.deleter.m_allocator = local_118.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_cmdPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_138);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  fenceParams._16_8_ = pHVar3->m_internal;
  ::vk::allocateCommandBuffer
            (&local_178,vk_00,device,(VkCommandPool)fenceParams._16_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_158,(Move *)&local_178);
  data_01.deleter.m_deviceIface = local_158.deleter.m_deviceIface;
  data_01.object = local_158.object;
  data_01.deleter.m_device = local_158.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_158.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_cmdBuffer,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_178);
  fenceParams.pNext = (void *)0x0;
  auStack_198 = (undefined1  [8])0x8;
  fenceParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  fenceParams._4_4_ = 0;
  ::vk::createFence(&local_1d8,vk_00,device,(VkFenceCreateInfo *)auStack_198,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data_02.deleter.m_deviceIface = local_1b8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1b8.object.m_internal;
  data_02.deleter.m_device = local_1b8.deleter.m_device;
  data_02.deleter.m_allocator = local_1b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=(&this->m_fence,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_1d8);
  sVar4 = std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::
          size(&this->m_stages);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (deUint64 *)operator_new__(uVar5);
  this->m_timestampValues = pdVar6;
  return;
}

Assistant:

TimestampTestInstance::TimestampTestInstance(Context&                context,
											 const StageFlagVector&  stages,
											 const bool              inRenderPass)
	: TestInstance  (context)
	, m_stages      (stages)
	, m_inRenderPass(inRenderPass)
{
	const DeviceInterface&      vk                  = context.getDeviceInterface();
	const VkDevice              vkDevice            = context.getDevice();
	const deUint32              queueFamilyIndex    = context.getUniversalQueueFamilyIndex();

	// Check support for timestamp queries
	{
		const std::vector<VkQueueFamilyProperties>   queueProperties = vk::getPhysicalDeviceQueueFamilyProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice());

		DE_ASSERT(queueFamilyIndex < (deUint32)queueProperties.size());

		if (!queueProperties[queueFamilyIndex].timestampValidBits)
			throw tcu::NotSupportedError("Universal queue does not support timestamps");
	}

	// Create Query Pool
	{
		const VkQueryPoolCreateInfo queryPoolParams =
		{
		   VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO,    // VkStructureType               sType;
		   DE_NULL,                                     // const void*                   pNext;
		   0u,                                          // VkQueryPoolCreateFlags        flags;
		   VK_QUERY_TYPE_TIMESTAMP,                     // VkQueryType                   queryType;
		   TimestampTest::ENTRY_COUNT,                  // deUint32                      entryCount;
		   0u,                                          // VkQueryPipelineStatisticFlags pipelineStatistics;
		};

		m_queryPool = createQueryPool(vk, vkDevice, &queryPoolParams);
	}

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	{
		const VkFenceCreateInfo fenceParams =
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,        // VkStructureType      sType;
			DE_NULL,                                    // const void*          pNext;
			0u,                                         // VkFenceCreateFlags   flags;
		};

		m_fence = createFence(vk, vkDevice, &fenceParams);
	}

	// alloc timestamp values
	m_timestampValues = new deUint64[m_stages.size()];
}